

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crash.h
# Opt level: O0

void __thiscall bandit::reporter::crash::it_failed(crash *this,string *desc,assertion_exception *ex)

{
  failure_formatter_t *pfVar1;
  ostream *poVar2;
  value_type local_218;
  string local_1f8 [48];
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  assertion_exception *local_20;
  assertion_exception *ex_local;
  string *desc_local;
  crash *this_local;
  
  (this->super_progress_base).specs_failed_ = (this->super_progress_base).specs_failed_ + 1;
  local_20 = ex;
  ex_local = (assertion_exception *)desc;
  desc_local = (string *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  progress_base::current_context_name_abi_cxx11_(&local_1c8,&this->super_progress_base);
  poVar2 = std::operator<<(local_198,(string *)&local_1c8);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,(string *)ex_local);
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pfVar1 = (this->super_progress_base).failure_formatter_;
  (*pfVar1->_vptr_interface[2])(local_1f8,pfVar1,local_20);
  std::operator<<(poVar2,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::stringstream::str();
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->super_progress_base).failures_,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  poVar2 = std::operator<<(this->stm_,"FAILED");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void it_failed(const std::string& desc, const detail::assertion_exception& ex) override {
        ++specs_failed_;

        std::stringstream ss;
        ss << current_context_name() << " " << desc << ":" << std::endl
           << failure_formatter_.format(ex);
        failures_.push_back(ss.str());

        stm_ << "FAILED" << std::endl;
      }